

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

bool __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump
          (DG2Dot<dg::LLVMNode> *this,char *new_file,char *only_functions)

{
  bool bVar1;
  reference ppDVar2;
  set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
  *in_RDI;
  DG2Dot<dg::LLVMNode> *unaff_retaddr;
  DependenceGraph<dg::LLVMNode> *sub;
  iterator __end0;
  iterator __begin0;
  set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
  *__range3;
  DG2Dot<dg::LLVMNode> *in_stack_00000060;
  DG2Dot<dg::LLVMNode> *in_stack_000000a0;
  DG2Dot<dg::LLVMNode> *in_stack_ffffffffffffffc0;
  DependenceGraph<dg::LLVMNode> *this_00;
  _Self in_stack_ffffffffffffffc8;
  _Self local_30;
  _Base_ptr *local_28;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = ensureFile((DG2Dot<dg::LLVMNode> *)in_stack_ffffffffffffffc8._M_node,
                     (char *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    start(in_stack_ffffffffffffffc0);
    dumpBBs((DG2Dot<dg::LLVMNode> *)new_file,(DependenceGraph<dg::LLVMNode> *)only_functions,
            __range3._4_4_);
    dump_nodes(in_stack_000000a0);
    dump_edges(in_stack_00000060);
    bVar1 = std::
            set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
            ::empty((set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
                     *)0x1c81c4);
    if (!bVar1) {
      std::operator<<((ostream *)&in_RDI[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                      "\n\t/* ----------- SUBGRAPHS ---------- */\n\n");
    }
    local_28 = &in_RDI[3]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_30._M_node =
         (_Base_ptr)
         std::
         set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
         ::begin(in_RDI);
    std::
    set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
    ::end(in_RDI);
    while( true ) {
      bVar1 = std::operator!=(&local_30,(_Self *)&stack0xffffffffffffffc8);
      if (!bVar1) break;
      ppDVar2 = std::_Rb_tree_const_iterator<dg::DependenceGraph<dg::LLVMNode>_*>::operator*
                          ((_Rb_tree_const_iterator<dg::DependenceGraph<dg::LLVMNode>_*> *)0x1c822b)
      ;
      this_00 = *ppDVar2;
      dump_subgraph(unaff_retaddr,
                    (DependenceGraph<dg::LLVMNode> *)
                    CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      std::_Rb_tree_const_iterator<dg::DependenceGraph<dg::LLVMNode>_*>::operator++
                ((_Rb_tree_const_iterator<dg::DependenceGraph<dg::LLVMNode>_*> *)this_00);
    }
    end((DG2Dot<dg::LLVMNode> *)0x1c8256);
    std::ofstream::close();
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

virtual bool dump(const char *new_file = nullptr,
                      const char *only_functions = nullptr) {
        (void) only_functions;

        if (!ensureFile(new_file))
            return false;

        start();

#ifdef ENABLE_CFG
        dumpBBs(dg);
#endif

        // even when we have printed nodes while
        // going through BBs, print nodes again,
        // so that we'll see if there are any nodes
        // that are not in BBs
        dump_nodes();
        dump_edges();

        // print subgraphs once we printed all the nodes
        if (!subgraphs.empty())
            out << "\n\t/* ----------- SUBGRAPHS ---------- */\n\n";
        for (auto sub : subgraphs) {
            dump_subgraph(sub);
        }

        end();

        out.close();
        return true;
    }